

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O1

void EncodeVarint(uint64_t val,string *str)

{
  bool bVar1;
  
  do {
    std::__cxx11::string::push_back((char)str);
    bVar1 = 0x7f < val;
    val = val >> 7;
  } while (bVar1);
  return;
}

Assistant:

void EncodeVarint(uint64_t val, std::string* str) {
  do {
    char byte = val & 0x7fU;
    val >>= 7;
    if (val) byte |= 0x80U;
    str->push_back(byte);
  } while (val);
}